

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathSubstringBeforeFunction(void)

{
  int iVar1;
  int iVar2;
  uint local_24;
  int n_nargs;
  int nargs;
  int n_ctxt;
  xmlXPathParserContextPtr ctxt;
  int mem_base;
  int test_ret;
  
  ctxt._4_4_ = 0;
  for (n_nargs = 0; n_nargs < 1; n_nargs = n_nargs + 1) {
    for (local_24 = 0; (int)local_24 < 4; local_24 = local_24 + 1) {
      iVar1 = xmlMemBlocks();
      iVar2 = gen_int(local_24,1);
      xmlXPathSubstringBeforeFunction(0,iVar2);
      call_tests = call_tests + 1;
      des_int(local_24,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathSubstringBeforeFunction",
               (ulong)(uint)(iVar2 - iVar1));
        ctxt._4_4_ = ctxt._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_nargs);
        printf(" %d",(ulong)local_24);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ctxt._4_4_;
}

Assistant:

static int
test_xmlXPathSubstringBeforeFunction(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlXPathParserContextPtr ctxt; /* the XPath Parser context */
    int n_ctxt;
    int nargs; /* the number of arguments */
    int n_nargs;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlXPathParserContextPtr;n_ctxt++) {
    for (n_nargs = 0;n_nargs < gen_nb_int;n_nargs++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlXPathParserContextPtr(n_ctxt, 0);
        nargs = gen_int(n_nargs, 1);

        xmlXPathSubstringBeforeFunction(ctxt, nargs);
        call_tests++;
        des_xmlXPathParserContextPtr(n_ctxt, ctxt, 0);
        des_int(n_nargs, nargs, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathSubstringBeforeFunction",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_nargs);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}